

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int cmdtog(errcxdef *ec,int prv,char *argp,int ofs,_func_void_errcxdef_ptr *usagefn)

{
  char cVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  code *in_R8;
  undefined4 local_4;
  
  cVar1 = *(char *)((long)in_ECX + 1 + in_RDX);
  if (cVar1 == '\0') {
    local_4 = (uint)((in_ESI != 0 ^ 0xffU) & 1);
  }
  else if (cVar1 == '+') {
    local_4 = 1;
  }
  else if (cVar1 == '-') {
    local_4 = 0;
  }
  else {
    if (in_R8 != (code *)0x0) {
      (*in_R8)(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cmdtog(errcxdef *ec, int prv, char *argp, int ofs,
           void (*usagefn)(errcxdef *))
{
    switch(argp[ofs + 1])
    {
    case '+':
        return(TRUE);
        
    case '-':
        return(FALSE);
        
    case '\0':
        return(!prv);
        
    default:
        /* invalid - display usage if we have a callback for it */
        if (usagefn != 0)
            (*usagefn)(ec);
        NOTREACHEDV(int);
        return 0;
    }
}